

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O0

void __thiscall TaprootScriptTree_TreeTest1_Test::TestBody(TaprootScriptTree_TreeTest1_Test *this)

{
  pointer pBVar1;
  bool bVar2;
  char *pcVar3;
  ScriptBuilder *pSVar4;
  char *in_R9;
  AssertHelper local_d88;
  Message local_d80;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_d78;
  size_type local_d60;
  int local_d54;
  undefined1 local_d50 [8];
  AssertionResult gtest_ar_14;
  Message local_d38;
  Script local_d30;
  string local_cf8;
  string local_cd8;
  undefined1 local_cb8 [8];
  AssertionResult gtest_ar_13;
  allocator local_c89;
  string local_c88;
  TaprootScriptTree local_c68;
  AssertHelper local_bd8;
  Message local_bd0;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_bc8;
  size_type local_bb0;
  int local_ba4;
  undefined1 local_ba0 [8];
  AssertionResult gtest_ar_12;
  Message local_b88;
  Script local_b80;
  string local_b48;
  string local_b28;
  undefined1 local_b08 [8];
  AssertionResult gtest_ar_11;
  allocator local_ad9;
  string local_ad8;
  TaprootScriptTree local_ab8;
  AssertHelper local_a28;
  Message local_a20;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_a18;
  size_type local_a00;
  int local_9f4;
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar_10;
  Message local_9d8;
  Script local_9d0;
  string local_998;
  string local_978;
  undefined1 local_958 [8];
  AssertionResult gtest_ar_9;
  allocator local_929;
  string local_928;
  TaprootScriptTree local_908;
  AssertHelper local_878;
  Message local_870;
  string local_868;
  undefined1 local_848 [8];
  AssertionResult gtest_ar_8;
  Message local_830;
  ByteData256 local_828;
  string local_810;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_7c8;
  Message local_7c0;
  string local_7b8;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_6;
  Message local_780;
  ByteData256 local_778;
  string local_760;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_5;
  TaprootScriptTree branch;
  Message local_698;
  string local_690;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_4;
  Message local_658;
  ByteData256 local_650;
  string local_638;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_3;
  Message local_600;
  string local_5f8;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_2;
  Message local_5c0;
  ByteData256 local_5b8;
  string local_5a0;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_1;
  TaprootScriptTree root;
  char *exp_str;
  char *exp_hash;
  TaprootScriptTree tree3;
  ByteData local_428;
  ScriptBuilder local_410;
  undefined1 local_3f0 [8];
  Script tree_2_of_2_sig;
  TaprootScriptTree tree2;
  undefined1 local_308 [8];
  Script script_true;
  TaprootScriptTree tree1;
  ScriptBuilder local_228;
  undefined1 local_208 [8];
  Script script;
  SchnorrPubkey schnorr_pubkey3;
  SchnorrPubkey schnorr_pubkey2;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_;
  Message local_158;
  string local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  SchnorrPubkey schnorr_pubkey;
  undefined1 local_100 [7];
  bool is_parity;
  Pubkey pubkey;
  string local_e0;
  undefined1 local_c0 [8];
  ByteData256 tweak2;
  string local_a0;
  undefined1 local_80 [8];
  ByteData256 tweak1;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootScriptTree_TreeTest1_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)
             ((long)&tweak2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tweak2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
             (allocator *)
             ((long)&pubkey.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pubkey.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::GeneratePubkey((Pubkey *)local_100,(Privkey *)local_30,true);
  schnorr_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)&gtest_ar.message_,(Pubkey *)local_100,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_150,(SchnorrPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_130,
             "\"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440\"",
             "schnorr_pubkey.GetHex()",
             (char (*) [65])"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
             &local_150);
  std::__cxx11::string::~string((string *)&local_150);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xc9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &schnorr_pubkey2.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_170,
               (AssertionResult *)"is_parity","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xca,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string
              ((string *)
               &schnorr_pubkey2.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  cfd::core::SchnorrPubkey::CreateTweakAdd
            ((SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_,
             (ByteData256 *)local_80,(bool *)0x0);
  cfd::core::SchnorrPubkey::CreateTweakAdd
            ((SchnorrPubkey *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_
             ,(ByteData256 *)local_c0,(bool *)0x0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_228);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &tree1.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_)
  ;
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (&local_228,
                      (ByteData *)
                      &tree1.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_208,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &tree1.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_228);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_208);
  cfd::core::ScriptBuilder::ScriptBuilder
            ((ScriptBuilder *)
             &tree2.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     ((ScriptBuilder *)
                      &tree2.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build((Script *)local_308,pSVar4);
  cfd::core::ScriptBuilder::~ScriptBuilder
            ((ScriptBuilder *)
             &tree2.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_308);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_410);
  cfd::core::SchnorrPubkey::GetData
            (&local_428,
             (SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<(&local_410,&local_428);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &tree3.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ByteData *)
                             &tree3.nodes_.
                              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar4 = cfd::core::ScriptBuilder::operator<<
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_3f0,pSVar4);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &tree3.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData(&local_428);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_410);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&exp_hash,(Script *)local_3f0);
  exp_str = "a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec";
  root.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_19f764;
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&gtest_ar_1.message_,
             (TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,
             (TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&exp_hash);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_5b8,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_5a0,&local_5b8);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_580,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_str
             ,&local_5a0);
  std::__cxx11::string::~string((string *)&local_5a0);
  cfd::core::ByteData256::~ByteData256(&local_5b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar2) {
    testing::Message::Message(&local_5c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_5f8,(TapBranch *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_5d8,"exp_str","root.ToString()",
             (char **)&root.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar2) {
    testing::Message::Message(&local_600);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_600);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  cfd::core::TaprootScriptTree::operator=
            ((TaprootScriptTree *)&gtest_ar_1.message_,
             (TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,
             (TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&exp_hash);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_650,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_638,&local_650);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_618,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_str
             ,&local_638);
  std::__cxx11::string::~string((string *)&local_638);
  cfd::core::ByteData256::~ByteData256(&local_650);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar2) {
    testing::Message::Message(&local_658);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_690,(TapBranch *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_670,"exp_str","root.ToString()",
             (char **)&root.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar2) {
    testing::Message::Message(&local_698);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &branch.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &branch.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_698);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &branch.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&gtest_ar_5.message_,
             (TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_5.message_,
             (TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::operator=
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&exp_hash);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&gtest_ar_5.message_);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_778,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_760,&local_778);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_740,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_str
             ,&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  cfd::core::ByteData256::~ByteData256(&local_778);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar2) {
    testing::Message::Message(&local_780);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xed,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_7b8,(TapBranch *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_798,"exp_str","root.ToString()",
             (char **)&root.nodes_.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar2) {
    testing::Message::Message(&local_7c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              (&local_7c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xee,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7c8,&local_7c0);
    testing::internal::AssertHelper::~AssertHelper(&local_7c8);
    testing::Message::~Message(&local_7c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  cfd::core::TaprootScriptTree::operator=
            ((TaprootScriptTree *)&gtest_ar_1.message_,(TaprootScriptTree *)&exp_hash);
  cfd::core::TapBranch::GetCurrentBranchHash
            ((ByteData256 *)&gtest_ar_7.message_,(TapBranch *)&gtest_ar_5.message_);
  cfd::core::TaprootScriptTree::AddBranch
            ((TaprootScriptTree *)&gtest_ar_1.message_,(ByteData256 *)&gtest_ar_7.message_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)&gtest_ar_7.message_);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_828,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_810,&local_828);
  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
            ((EqHelper<false> *)local_7f0,"exp_hash","root.GetCurrentBranchHash().GetHex()",&exp_str
             ,&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  cfd::core::ByteData256::~ByteData256(&local_828);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar2) {
    testing::Message::Message(&local_830);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xf3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_868,(TapBranch *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char[208],std::__cxx11::string>
            ((EqHelper<false> *)local_848,
             "\"{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}\""
             ,"root.ToString()",
             (char (*) [208])
             "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
             ,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
  if (!bVar2) {
    testing::Message::Message(&local_870);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_848);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xf6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_878,&local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    testing::Message::~Message(&local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
  pBVar1 = root.nodes_.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_928,(char *)pBVar1,&local_929);
  gtest_ar_9.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_9.message_);
  cfd::core::TaprootScriptTree::FromString
            (&local_908,&local_928,(Script *)local_208,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_9.message_);
  cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_1.message_,&local_908);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_908);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_9.message_);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator((allocator<char> *)&local_929);
  cfd::core::Script::GetHex_abi_cxx11_(&local_978,(Script *)local_208);
  cfd::core::TapBranch::GetScript(&local_9d0,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_998,&local_9d0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_958,"script.GetHex()","root.GetScript().GetHex()",&local_978,
             &local_998);
  std::__cxx11::string::~string((string *)&local_998);
  cfd::core::Script::~Script(&local_9d0);
  std::__cxx11::string::~string((string *)&local_978);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
  if (!bVar2) {
    testing::Message::Message(&local_9d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_958);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xf9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
  local_9f4 = 2;
  cfd::core::TapBranch::GetBranchList(&local_a18,(TapBranch *)&gtest_ar_1.message_);
  local_a00 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                        (&local_a18);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_9f0,"2","root.GetBranchList().size()",&local_9f4,&local_a00);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_a18);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
  if (!bVar2) {
    testing::Message::Message(&local_a20);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_a28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xfa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a28,&local_a20);
    testing::internal::AssertHelper::~AssertHelper(&local_a28);
    testing::Message::~Message(&local_a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
  pBVar1 = root.nodes_.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ad8,(char *)pBVar1,&local_ad9);
  gtest_ar_11.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_11.message_);
  cfd::core::TaprootScriptTree::FromString
            (&local_ab8,&local_ad8,(Script *)local_308,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_11.message_);
  cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_1.message_,&local_ab8);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_ab8);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_11.message_);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  cfd::core::Script::GetHex_abi_cxx11_(&local_b28,(Script *)local_308);
  cfd::core::TapBranch::GetScript(&local_b80,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_b48,&local_b80);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_b08,"script_true.GetHex()","root.GetScript().GetHex()",
             &local_b28,&local_b48);
  std::__cxx11::string::~string((string *)&local_b48);
  cfd::core::Script::~Script(&local_b80);
  std::__cxx11::string::~string((string *)&local_b28);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b08);
  if (!bVar2) {
    testing::Message::Message(&local_b88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xfd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_b88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b08);
  local_ba4 = 2;
  cfd::core::TapBranch::GetBranchList(&local_bc8,(TapBranch *)&gtest_ar_1.message_);
  local_bb0 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                        (&local_bc8);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_ba0,"2","root.GetBranchList().size()",&local_ba4,&local_bb0);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_bc8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba0);
  if (!bVar2) {
    testing::Message::Message(&local_bd0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ba0);
    testing::internal::AssertHelper::AssertHelper
              (&local_bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xfe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_bd8,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_bd8);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba0);
  pBVar1 = root.nodes_.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c88,(char *)pBVar1,&local_c89);
  gtest_ar_13.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_13.message_);
  cfd::core::TaprootScriptTree::FromString
            (&local_c68,&local_c88,(Script *)local_3f0,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_13.message_);
  cfd::core::TaprootScriptTree::operator=((TaprootScriptTree *)&gtest_ar_1.message_,&local_c68);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_c68);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &gtest_ar_13.message_);
  std::__cxx11::string::~string((string *)&local_c88);
  std::allocator<char>::~allocator((allocator<char> *)&local_c89);
  cfd::core::Script::GetHex_abi_cxx11_(&local_cd8,(Script *)local_3f0);
  cfd::core::TapBranch::GetScript(&local_d30,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_cf8,&local_d30);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_cb8,"tree_2_of_2_sig.GetHex()","root.GetScript().GetHex()",
             &local_cd8,&local_cf8);
  std::__cxx11::string::~string((string *)&local_cf8);
  cfd::core::Script::~Script(&local_d30);
  std::__cxx11::string::~string((string *)&local_cd8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb8);
  if (!bVar2) {
    testing::Message::Message(&local_d38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x101,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_d38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_d38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb8);
  local_d54 = 1;
  cfd::core::TapBranch::GetBranchList(&local_d78,(TapBranch *)&gtest_ar_1.message_);
  local_d60 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                        (&local_d78);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_d50,"1","root.GetBranchList().size()",&local_d54,&local_d60);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_d78);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
  if (!bVar2) {
    testing::Message::Message(&local_d80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d50);
    testing::internal::AssertHelper::AssertHelper
              (&local_d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x102,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d88,&local_d80);
    testing::internal::AssertHelper::~AssertHelper(&local_d88);
    testing::Message::~Message(&local_d80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_5.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_1.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&exp_hash);
  cfd::core::Script::~Script((Script *)local_3f0);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &tree_2_of_2_sig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script((Script *)local_308);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &script_true.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script((Script *)local_208);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &schnorr_pubkey3.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_100);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_c0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTest1) {
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  ByteData256 tweak1("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  ByteData256 tweak2("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);
  SchnorrPubkey schnorr_pubkey2 = schnorr_pubkey.CreateTweakAdd(tweak1);
  SchnorrPubkey schnorr_pubkey3 = schnorr_pubkey.CreateTweakAdd(tweak2);

  Script script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  TaprootScriptTree tree1(script);

  Script script_true = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  TaprootScriptTree tree2(script_true);

  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script tree_2_of_2_sig = (ScriptBuilder() << schnorr_pubkey2.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey3.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  TaprootScriptTree tree3(tree_2_of_2_sig);

  auto exp_hash = "a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec";
  auto exp_str = "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}";
  TaprootScriptTree root = tree1;
  root.AddBranch(tree2);
  root.AddBranch(tree3);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  root = tree2;
  root.AddBranch(tree1);
  root.AddBranch(tree3);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  auto branch = tree2;
  branch.AddBranch(tree1);
  root = tree3;
  root.AddBranch(branch);
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, root.ToString());

  // blind leaf
  root = tree3;
  root.AddBranch(branch.GetCurrentBranchHash());
  EXPECT_EQ(exp_hash, root.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(
      "{af151388d3bfbebcdc87e4a0b4a97bbfa378f2e5a909eb38a6978cb2a71f39c4,tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
      root.ToString());

  root = TaprootScriptTree::FromString(exp_str, script);
  EXPECT_EQ(script.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(2, root.GetBranchList().size());

  root = TaprootScriptTree::FromString(exp_str, script_true);
  EXPECT_EQ(script_true.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(2, root.GetBranchList().size());

  root = TaprootScriptTree::FromString(exp_str, tree_2_of_2_sig);
  EXPECT_EQ(tree_2_of_2_sig.GetHex(), root.GetScript().GetHex());
  EXPECT_EQ(1, root.GetBranchList().size());
}